

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::clear_error(torrent *this)

{
  bool bVar1;
  bool bVar2;
  EVP_PKEY_CTX *in_RSI;
  bool checking_files;
  torrent *this_local;
  
  bVar1 = boost::system::error_code::operator_cast_to_bool(&this->m_error);
  if (bVar1) {
    bVar1 = should_check_files(this);
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c])
              ();
    boost::system::error_code::clear(&this->m_error);
    (this->m_error_file).m_val = -1;
    update_gauge(this);
    state_updated(this);
    update_want_peers(this);
    update_state_list(this);
    if ((((byte)this->field_0x606 >> 4 & 1) == 0) && (bVar2 = valid_metadata(this), bVar2)) {
      init(this,in_RSI);
    }
    if ((!bVar1) && (bVar1 = should_check_files(this), bVar1)) {
      start_checking(this);
    }
  }
  return;
}

Assistant:

void torrent::clear_error()
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_error) return;
		bool const checking_files = should_check_files();
		m_ses.trigger_auto_manage();
		m_error.clear();
		m_error_file = torrent_status::error_file_none;

		update_gauge();
		state_updated();
		update_want_peers();
		update_state_list();

		// if the error happened during initialization, try again now
		if (!m_torrent_initialized && valid_metadata()) init();
		if (!checking_files && should_check_files())
			start_checking();
	}